

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.h
# Opt level: O2

int tx_size_cost(MACROBLOCK *x,BLOCK_SIZE bsize,TX_SIZE tx_size)

{
  bool bVar1;
  bool bVar2;
  MB_MODE_INFO *pMVar3;
  int iVar4;
  long lVar5;
  byte bVar6;
  undefined7 in_register_00000031;
  byte *pbVar7;
  byte bVar8;
  
  iVar4 = 0;
  if (((int)CONCAT71(in_register_00000031,bsize) != 0) &&
     (iVar4 = 0, (x->txfm_search_params).tx_mode_search_type == '\x02')) {
    lVar5 = (long)(x->mode_costs).skip_txfm_cost +
            (ulong)(byte)bsize_to_tx_size_cat_bsize_to_tx_size_depth_table[bsize] * 0x3c + -0x24;
    for (pbVar7 = "" + bsize; *pbVar7 != tx_size; pbVar7 = "" + *pbVar7) {
      lVar5 = lVar5 + 4;
    }
    bVar1 = (x->e_mbd).up_available;
    bVar2 = (x->e_mbd).left_available;
    bVar6 = *(x->e_mbd).above_txfm_context;
    if ((bVar1 == true) &&
       ((pMVar3 = (x->e_mbd).above_mbmi, (pMVar3->field_0xa7 & 0x80) != 0 ||
        ('\0' < pMVar3->ref_frame[0])))) {
      bVar6 = block_size_wide[pMVar3->bsize];
    }
    bVar8 = *(x->e_mbd).left_txfm_context;
    if ((bVar2 != false) &&
       ((pMVar3 = (x->e_mbd).left_mbmi, (pMVar3->field_0xa7 & 0x80) != 0 ||
        ('\0' < pMVar3->ref_frame[0])))) {
      bVar8 = block_size_high[pMVar3->bsize];
    }
    iVar4 = *(int *)(lVar5 + ((ulong)(byte)(bVar1 & tx_size_wide[""[(*(x->e_mbd).mi)->bsize]] <=
                                                    (int)(uint)bVar6) +
                             (ulong)(byte)(bVar2 & tx_size_high[""[(*(x->e_mbd).mi)->bsize]] <=
                                                   (int)(uint)bVar8)) * 0x14);
  }
  return iVar4;
}

Assistant:

static inline int tx_size_cost(const MACROBLOCK *const x, BLOCK_SIZE bsize,
                               TX_SIZE tx_size) {
  assert(bsize == x->e_mbd.mi[0]->bsize);
  if (x->txfm_search_params.tx_mode_search_type != TX_MODE_SELECT ||
      !block_signals_txsize(bsize))
    return 0;

  const int32_t tx_size_cat = bsize_to_tx_size_cat(bsize);
  const int depth = tx_size_to_depth(tx_size, bsize);
  const MACROBLOCKD *const xd = &x->e_mbd;
  const int tx_size_ctx = get_tx_size_context(xd);
  return x->mode_costs.tx_size_cost[tx_size_cat][tx_size_ctx][depth];
}